

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

bool __thiscall
soplex::SPxSolverBase<double>::precisionReached(SPxSolverBase<double> *this,double *newpricertol)

{
  SPxOut *pSVar1;
  char cVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  Real RVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double maxViolConst;
  double maxViolBounds;
  double sumViolConst;
  double sumViolBounds;
  double sumViolRedCost;
  double maxViolRedCost;
  Verbosity old_verbosity;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined4 local_30;
  Verbosity local_2c;
  
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x72])(this,&local_38,&local_40);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x70])(this,&local_58,&local_48);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6f])(this,&local_60,&local_50);
  dVar3 = local_38;
  RVar6 = Tolerances::floatingPointOpttol
                    ((this->super_SPxLPBase<double>)._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  dVar4 = local_58;
  if (dVar3 < RVar6) {
    RVar6 = Tolerances::floatingPointFeastol
                      ((this->super_SPxLPBase<double>)._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    dVar3 = local_60;
    if (dVar4 < RVar6) {
      RVar6 = Tolerances::floatingPointFeastol
                        ((this->super_SPxLPBase<double>)._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      bVar5 = dVar3 < RVar6;
      goto LAB_001d8765;
    }
  }
  bVar5 = false;
LAB_001d8765:
  if (bVar5 == false) {
    (*this->thepricer->_vptr_SPxPricer[5])();
    *newpricertol = extraout_XMM0_Qa / 10.0;
    pSVar1 = this->spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (local_2c = pSVar1->m_verbosity, 4 < (int)local_2c)) {
      local_30 = 5;
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"Precision not reached: Pricer tolerance = "
                 ,0x2a);
      (*this->thepricer->_vptr_SPxPricer[5])();
      std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," new tolerance = ",0x11);
      std::ostream::_M_insert<double>(*newpricertol);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," maxViolRedCost= ",0x11);
      std::ostream::_M_insert<double>(local_38);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," maxViolBounds= ",0x10);
      std::ostream::_M_insert<double>(local_58);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," maxViolConst= ",0xf);
      std::ostream::_M_insert<double>(local_60);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," sumViolRedCost= ",0x11);
      std::ostream::_M_insert<double>(local_40);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," sumViolBounds= ",0x10);
      std::ostream::_M_insert<double>(local_48);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity]," sumViolConst= ",0xf);
      std::ostream::_M_insert<double>(local_50);
      cVar2 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_2c);
    }
  }
  return bVar5;
}

Assistant:

bool SPxSolverBase<R>::precisionReached(R& newpricertol) const
{
   R maxViolRedCost;
   R sumViolRedCost;
   R maxViolBounds;
   R sumViolBounds;
   R maxViolConst;
   R sumViolConst;

   qualRedCostViolation(maxViolRedCost, sumViolRedCost);
   qualBoundViolation(maxViolBounds, sumViolBounds);
   qualConstraintViolation(maxViolConst, sumViolConst);

   // is the solution good enough ?
   bool reached = maxViolRedCost < tolerances()->floatingPointOpttol()
                  && maxViolBounds < tolerances()->floatingPointFeastol()
                  && maxViolConst < tolerances()->floatingPointFeastol();

   if(!reached)
   {
      newpricertol = thepricer->pricingTolerance() / 10.0;

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Precision not reached: Pricer tolerance = "
                    << thepricer->pricingTolerance()
                    << " new tolerance = " << newpricertol
                    << std::endl
                    << " maxViolRedCost= " << maxViolRedCost
                    << " maxViolBounds= " << maxViolBounds
                    << " maxViolConst= " << maxViolConst
                    << std::endl
                    << " sumViolRedCost= " << sumViolRedCost
                    << " sumViolBounds= " << sumViolBounds
                    << " sumViolConst= " << sumViolConst
                    << std::endl;);
   }

   return reached;
}